

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O3

Float __thiscall pbrt::LanczosSincFilter::Evaluate(LanczosSincFilter *this,Point2f *p)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).x;
  fVar2 = this->tau;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar4);
  if (auVar4._0_4_ <= (this->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
    fVar5 = fVar1 * 3.1415927;
    auVar9 = SUB6416(ZEXT464(0x3f800000),0);
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),auVar9);
    if ((auVar4._0_4_ != 1.0) || (NAN(auVar4._0_4_))) {
      fVar7 = sinf(fVar5);
      auVar9._0_4_ = fVar7 / fVar5;
      auVar9._4_12_ = extraout_var;
    }
    fVar5 = 1.0;
    fVar1 = (fVar1 / fVar2) * 3.1415927;
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    if ((auVar4._0_4_ != 1.0) || (NAN(auVar4._0_4_))) {
      fVar5 = sinf(fVar1);
      fVar5 = fVar5 / fVar1;
    }
    fVar2 = this->tau;
    fVar5 = auVar9._0_4_ * fVar5;
  }
  else {
    fVar5 = 0.0;
  }
  fVar7 = 0.0;
  fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).y;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar3);
  if (auVar4._0_4_ <= (this->radius).super_Tuple2<pbrt::Vector2,_float>.y) {
    fVar7 = fVar1 * 3.1415927;
    auVar8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),auVar8);
    if ((auVar4._0_4_ != 1.0) || (NAN(auVar4._0_4_))) {
      fVar6 = sinf(fVar7);
      auVar8._0_4_ = fVar6 / fVar7;
      auVar8._4_12_ = extraout_var_00;
    }
    fVar7 = 1.0;
    fVar1 = (fVar1 / fVar2) * 3.1415927;
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    if ((auVar4._0_4_ != 1.0) || (NAN(auVar4._0_4_))) {
      fVar7 = sinf(fVar1);
      fVar7 = fVar7 / fVar1;
    }
    fVar7 = auVar8._0_4_ * fVar7;
  }
  return fVar5 * fVar7;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(const Point2f &p) const {
        return WindowedSinc(p.x, radius.x, tau) * WindowedSinc(p.y, radius.y, tau);
    }